

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O2

void crash_handler(int param_1)

{
  uint uVar1;
  pointer pPVar2;
  ThreadedReplayer *this;
  bool bVar3;
  uint i;
  ulong uVar4;
  long in_FS_OFFSET;
  char buffer [64];
  
  bVar3 = write_all(crash_fd,"CRASH\n");
  this = global_replayer;
  if ((bVar3) && (global_replayer != (ThreadedReplayer *)0x0)) {
    uVar1 = *(uint *)(in_FS_OFFSET + -0x18);
    pPVar2 = (global_replayer->per_thread_data).
             super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      if (pPVar2[uVar1].num_failed_module_hashes <= uVar4) {
        if (((pPVar2[uVar1].current_graphics_pipeline != 0) ||
            (pPVar2[uVar1].current_compute_pipeline != 0)) ||
           (pPVar2[uVar1].current_raytracing_pipeline != 0)) {
          sprintf(buffer,"GRAPHICS %d %lx\n",(ulong)pPVar2[uVar1].current_graphics_index);
          bVar3 = write_all(crash_fd,buffer);
          if (!bVar3) break;
          sprintf(buffer,"COMPUTE %d %lx\n",(ulong)pPVar2[uVar1].current_compute_index,
                  pPVar2[uVar1].current_compute_pipeline);
          bVar3 = write_all(crash_fd,buffer);
          if (!bVar3) break;
          sprintf(buffer,"RAYTRACE %d %lx\n",(ulong)pPVar2[uVar1].current_raytracing_index,
                  pPVar2[uVar1].current_raytracing_pipeline);
          bVar3 = write_all(crash_fd,buffer);
          if (!bVar3) break;
        }
        ThreadedReplayer::emergency_teardown(this);
        break;
      }
      sprintf(buffer,"MODULE %lx\n",pPVar2[uVar1].failed_module_hashes[uVar4]);
      bVar3 = write_all(crash_fd,buffer);
      uVar4 = uVar4 + 1;
    } while (bVar3);
  }
  _exit(2);
}

Assistant:

static void crash_handler(int)
{
	// stderr is reserved for generic logging.
	// stdout/stdin is for IPC with master process.

	if (!write_all(crash_fd, "CRASH\n"))
		_exit(2);

	// This might hang indefinitely if we are exceptionally unlucky,
	// the parent will have a timeout after receiving the crash message.
	// If that fails, it can SIGKILL us.
	// We want to make sure any database writing threads in the driver gets a chance to complete its work
	// before we die.

	if (global_replayer)
	{
		auto &per_thread = global_replayer->get_per_thread_data();
		crash_handler(*global_replayer, per_thread);
	}

	// Clean exit instead of reporting the segfault.
	// _exit is async-signal safe, but not exit().
	// Use exit code 2 to mark a segfaulted child.
	_exit(2);
}